

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.h
# Opt level: O0

Output * __thiscall senjo::Output::operator<<(Output *this,char **x)

{
  char **x_local;
  Output *this_local;
  
  std::operator<<((ostream *)&std::cout,*x);
  return this;
}

Assistant:

Output& operator<<(const T& x) {
    std::cout << x;
    return *this;
  }